

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

value class_metadata_constructors(klass cls)

{
  constructor pcVar1;
  value *ppvVar2;
  value pvVar3;
  long in_RDI;
  value *ctors_array;
  value v;
  value *v_array;
  size_t size;
  size_t iterator;
  value in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  value *in_stack_ffffffffffffffd0;
  constructor ctor;
  value *local_8;
  
  pcVar1 = (constructor)vector_size(*(undefined8 *)(in_RDI + 0x28));
  local_8 = (value *)value_create_array(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_8 == (value *)0x0) {
    local_8 = (value *)0x0;
  }
  else {
    ppvVar2 = value_to_array((value)0x109b6f);
    pvVar3 = value_create_string((char *)local_8,in_stack_ffffffffffffffc8);
    *ppvVar2 = pvVar3;
    if (*ppvVar2 == (value)0x0) {
      value_type_destroy(in_stack_00000040);
      local_8 = (value *)0x0;
    }
    else {
      pvVar3 = value_create_array(local_8,in_stack_ffffffffffffffc8);
      ppvVar2[1] = pvVar3;
      if (ppvVar2[1] == (value)0x0) {
        value_type_destroy(in_stack_00000040);
        local_8 = (value *)0x0;
      }
      else {
        ppvVar2 = value_to_array((value)0x109bfc);
        for (ctor = (constructor)0x0; ctor < pcVar1;
            ctor = (constructor)((long)&ctor->visibility + 1)) {
          vector_at(*(undefined8 *)(in_RDI + 0x28),ctor);
          pvVar3 = constructor_metadata(ctor);
          ppvVar2[(long)ctor] = pvVar3;
        }
      }
    }
  }
  return local_8;
}

Assistant:

value class_metadata_constructors(klass cls)
{
	static const char constructors_str[] = "constructors";
	size_t iterator, size = vector_size(cls->constructors);
	value *v_array, v = value_create_array(NULL, 2);
	value *ctors_array;

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);
	v_array[0] = value_create_string(constructors_str, sizeof(constructors_str) - 1);

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_array[1] = value_create_array(NULL, size);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	ctors_array = value_to_array(v_array[1]);

	for (iterator = 0; iterator < size; ++iterator)
	{
		ctors_array[iterator] = constructor_metadata(vector_at_type(cls->constructors, iterator, constructor));
	}

	return v;
}